

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::XMLReader::skippedString(XMLReader *this,XMLCh *toSkip)

{
  bool bVar1;
  int iVar2;
  XMLSize_t XVar3;
  XMLSize_t XVar4;
  XMLSize_t tmp;
  XMLSize_t charsLeft;
  XMLSize_t srcLen;
  XMLCh *toSkip_local;
  XMLReader *this_local;
  
  XVar3 = XMLString::stringLen(toSkip);
  tmp = charsLeftInBuffer(this);
  while( true ) {
    if (XVar3 <= tmp) {
      iVar2 = memcmp(this->fCharBuf + this->fCharIndex,toSkip,XVar3 << 1);
      if (iVar2 != 0) {
        return false;
      }
      this->fCurCol = XVar3 + this->fCurCol;
      this->fCharIndex = XVar3 + this->fCharIndex;
      return true;
    }
    bVar1 = refreshCharBuffer(this);
    if (!bVar1) break;
    XVar4 = charsLeftInBuffer(this);
    bVar1 = XVar4 == tmp;
    tmp = XVar4;
    if (bVar1) {
      return false;
    }
  }
  return false;
}

Assistant:

bool XMLReader::skippedString(const XMLCh* const toSkip)
{
    // This function works on strings that are smaller than kCharBufSize.
    // This function guarantees that in case the comparison is unsuccessful
    // the fCharIndex will point to the original data.
    //

    // Get the length of the string to skip.
    //
    const XMLSize_t srcLen = XMLString::stringLen(toSkip);
    XMLSize_t charsLeft = charsLeftInBuffer();

    //  See if the current reader has enough chars to test against this
    //  string. If not, then ask it to reload its buffer. If that does not
    //  get us enough, then it cannot match.
    //
    //  NOTE: This works because strings never have to cross a reader! And
    //  a string to skip will never have a new line in it, so we will never
    //  miss adjusting the current line.
    //
    while (charsLeft < srcLen)
    {
      if (!refreshCharBuffer())
        return false;

      XMLSize_t tmp = charsLeftInBuffer();
      if (tmp == charsLeft) // if the refreshCharBuf() did not add anything new
        return false;     // give up and return.

      charsLeft = tmp;
    }

    //  Ok, now we now that the current reader has enough chars in its
    //  buffer and that its index is back at zero. So we can do a quick and
    //  dirty comparison straight to its buffer with no requirement to unget
    //  if it fails.
    //
    if (memcmp(&fCharBuf[fCharIndex], toSkip, srcLen * sizeof(XMLCh)))
      return false;

    // Add the source length to the current column to get it back right.
    //
    fCurCol += (XMLFileLoc)srcLen;

    //  And get the character buffer index back right by just adding the
    //  source len to it.
    //
    fCharIndex += srcLen;

    return true;
}